

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

_Bool store_check_num(store *store,object *obj)

{
  _Bool _Var1;
  object *obj1;
  
  _Var1 = true;
  if ((store->stock_size <= (short)(ushort)store->stock_num) && (store->sidx != store_merchant_idx))
  {
    obj1 = store->stock;
    if (store->sidx == store_home_idx) {
      if (obj1 != (object *)0x0) {
        do {
          _Var1 = object_mergeable(obj1,obj,OSTACK_PACK);
          if (_Var1) {
            return _Var1;
          }
          obj1 = obj1->next;
        } while (obj1 != (object *)0x0);
        return _Var1;
      }
    }
    else if (obj1 != (object *)0x0) {
      do {
        _Var1 = object_mergeable(obj1,obj,OSTACK_STORE);
        if (_Var1) {
          return _Var1;
        }
        obj1 = obj1->next;
      } while (obj1 != (object *)0x0);
      return _Var1;
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool store_check_num(struct store *store, const struct object *obj)
{
	struct object *stock_obj;

	/* Free space is always usable */
	if (store->stock_num < store->stock_size) return true;

	/* Merchant will take anything */
	if (store_is_merchant(store)) return true;

	/* The "home" acts like the player */
	if (store_is_home(store)) {
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Can the new object be combined with the old one? */
			if (object_mergeable(stock_obj, obj, OSTACK_PACK))
				return true;
		}
	} else {
		/* Normal stores do special stuff */
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Can the new object be combined with the old one? */
			if (object_mergeable(stock_obj, obj, OSTACK_STORE))
				return true;
		}
	}

	/* But there was no room at the inn... */
	return false;
}